

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm_print.c
# Opt level: O0

void easm_print_operand(FILE *out,envy_colors *cols,easm_operand *operand)

{
  int local_24;
  int i;
  easm_operand *operand_local;
  envy_colors *cols_local;
  FILE *out_local;
  
  easm_print_mods(out,cols,operand->mods,0);
  for (local_24 = 0; local_24 < operand->exprsnum; local_24 = local_24 + 1) {
    if (local_24 != 0) {
      fprintf((FILE *)out," %s|%s",cols->sym,cols->reset);
    }
    fprintf((FILE *)out," ");
    easm_print_sexpr(out,cols,operand->exprs[local_24],-1);
  }
  return;
}

Assistant:

void easm_print_operand(FILE *out, const struct envy_colors *cols, struct easm_operand *operand) {
	int i;
	easm_print_mods(out, cols, operand->mods, 0);
	for (i = 0; i < operand->exprsnum; i++) {
		if (i)
			fprintf(out, " %s|%s", cols->sym, cols->reset);
		fprintf(out, " ");
		easm_print_sexpr(out, cols, operand->exprs[i], -1);
	}
}